

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 * nk_draw_list_alloc_path(nk_draw_list *list,int count)

{
  void *pvVar1;
  void *memory;
  nk_vec2 *points;
  int count_local;
  nk_draw_list *list_local;
  
  list_local = (nk_draw_list *)nk_buffer_alloc(list->buffer,NK_BUFFER_FRONT,(long)count << 3,4);
  if (list_local == (nk_draw_list *)0x0) {
    list_local = (nk_draw_list *)0x0;
  }
  else {
    if (list->path_offset == 0) {
      pvVar1 = nk_buffer_memory(list->buffer);
      list->path_offset = (int)list_local - (int)pvVar1;
    }
    list->path_count = count + list->path_count;
  }
  return (nk_vec2 *)list_local;
}

Assistant:

NK_INTERN struct nk_vec2*
nk_draw_list_alloc_path(struct nk_draw_list *list, int count)
{
    struct nk_vec2 *points;
    NK_STORAGE const nk_size point_align = NK_ALIGNOF(struct nk_vec2);
    NK_STORAGE const nk_size point_size = sizeof(struct nk_vec2);
    points = (struct nk_vec2*)
        nk_buffer_alloc(list->buffer, NK_BUFFER_FRONT,
                        point_size * (nk_size)count, point_align);

    if (!points) return 0;
    if (!list->path_offset) {
        void *memory = nk_buffer_memory(list->buffer);
        list->path_offset = (unsigned int)((nk_byte*)points - (nk_byte*)memory);
    }
    list->path_count += (unsigned int)count;
    return points;
}